

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O3

duckdb_value
duckdb_create_list_value(duckdb_logical_type type,duckdb_value *values,idx_t value_count)

{
  bool bVar1;
  Value *this;
  idx_t iVar2;
  vector<duckdb::Value,_true> unwrapped_values;
  LogicalTypeId local_b9;
  pointer local_b8;
  pointer pVStack_b0;
  pointer local_a8;
  LogicalType local_a0;
  vector<duckdb::Value,_true> local_88;
  Value local_70;
  
  if (values == (duckdb_value *)0x0 || type == (duckdb_logical_type)0x0) {
    return (duckdb_value)0x0;
  }
  local_b8 = (pointer)0x0;
  pVStack_b0 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  local_b9 = INVALID;
  local_70.type_._0_8_ = &local_b9;
  bVar1 = duckdb::TypeVisitor::
          Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                    ((LogicalType *)type,(anon_class_8_1_50811320 *)&local_70);
  if (!bVar1) {
    local_b9 = ANY;
    local_70.type_._0_8_ = &local_b9;
    bVar1 = duckdb::TypeVisitor::
            Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                      ((LogicalType *)type,(anon_class_8_1_50811320 *)&local_70);
    if (!bVar1) {
      if (value_count != 0) {
        this = (Value *)0x0;
        iVar2 = 0;
        do {
          if ((value_type *)values[iVar2] == (value_type *)0x0) goto LAB_015d9b9d;
          std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8,
                     (value_type *)values[iVar2]);
          iVar2 = iVar2 + 1;
        } while (value_count != iVar2);
      }
      this = (Value *)operator_new(0x40);
      duckdb::LogicalType::LogicalType(&local_a0,SQLNULL);
      duckdb::Value::Value(this,&local_a0);
      duckdb::LogicalType::~LogicalType(&local_a0);
      local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = local_b8;
      local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_b0;
      local_88.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_a8;
      local_b8 = (pointer)0x0;
      pVStack_b0 = (pointer)0x0;
      local_a8 = (pointer)0x0;
      duckdb::Value::LIST(&local_70,(LogicalType *)type,&local_88);
      duckdb::Value::operator=(this,&local_70);
      duckdb::Value::~Value(&local_70);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_88);
      goto LAB_015d9b9d;
    }
  }
  this = (Value *)0x0;
LAB_015d9b9d:
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8);
  return (duckdb_value)this;
}

Assistant:

duckdb_value duckdb_create_list_value(duckdb_logical_type type, duckdb_value *values, idx_t value_count) {
	if (!type || !values) {
		return nullptr;
	}
	auto &logical_type = UnwrapType(type);
	duckdb::vector<duckdb::Value> unwrapped_values;
	if (duckdb::TypeVisitor::Contains(logical_type, duckdb::LogicalTypeId::INVALID) ||
	    duckdb::TypeVisitor::Contains(logical_type, duckdb::LogicalTypeId::ANY)) {
		return nullptr;
	}

	for (idx_t i = 0; i < value_count; i++) {
		auto value = values[i];
		if (!value) {
			return nullptr;
		}
		unwrapped_values.push_back(UnwrapValue(value));
	}
	duckdb::Value *list_value = new duckdb::Value;
	try {
		*list_value = duckdb::Value::LIST(logical_type, std::move(unwrapped_values));
	} catch (...) {
		delete list_value;
		return nullptr;
	}
	return WrapValue(list_value);
}